

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_sort.c
# Opt level: O0

REF_STATUS ref_sort_insertion_int(REF_INT n,REF_INT *original,REF_INT *sorted)

{
  REF_INT RVar1;
  int local_2c;
  REF_INT temp;
  REF_INT smallest;
  REF_INT j;
  REF_INT i;
  REF_INT *sorted_local;
  REF_INT *original_local;
  REF_INT n_local;
  
  for (smallest = 0; smallest < n; smallest = smallest + 1) {
    sorted[smallest] = original[smallest];
  }
  for (smallest = 0; smallest < n; smallest = smallest + 1) {
    local_2c = smallest;
    temp = smallest;
    while (temp = temp + 1, temp < n) {
      if (sorted[temp] < sorted[local_2c]) {
        local_2c = temp;
      }
    }
    RVar1 = sorted[smallest];
    sorted[smallest] = sorted[local_2c];
    sorted[local_2c] = RVar1;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_sort_insertion_int(REF_INT n, REF_INT *original,
                                          REF_INT *sorted) {
  REF_INT i, j, smallest, temp;

  for (i = 0; i < n; i++) sorted[i] = original[i];

  for (i = 0; i < n; i++) {
    smallest = i;
    for (j = i + 1; j < n; j++) {
      if (sorted[j] < sorted[smallest]) smallest = j;
    }
    temp = sorted[i];
    sorted[i] = sorted[smallest];
    sorted[smallest] = temp;
  }

  return REF_SUCCESS;
}